

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

int __thiscall ON_MorphControl::CVCount(ON_MorphControl *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = this->m_varient;
  if (iVar1 == 3) {
    iVar2 = (this->m_nurbs_cage).m_cv_count[1] * (this->m_nurbs_cage).m_cv_count[0] *
            (this->m_nurbs_cage).m_cv_count[2];
  }
  else {
    if (iVar1 == 2) {
      iVar1 = ON_NurbsSurface::CVCount(&this->m_nurbs_surface);
      return iVar1;
    }
    iVar2 = 0;
    if (iVar1 == 1) {
      iVar1 = ON_NurbsCurve::CVCount(&this->m_nurbs_curve);
      return iVar1;
    }
  }
  return iVar2;
}

Assistant:

int ON_MorphControl::CVCount() const
{
  int rc = 0;
  switch(m_varient)
  {
  case 1:
    rc = m_nurbs_curve.CVCount();
    break;
  case 2:
    rc = m_nurbs_surface.CVCount();
    break;
  case 3:
    rc = m_nurbs_cage.CVCount();
    break;
  }
  return rc;
}